

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# producer.cpp
# Opt level: O3

void __thiscall pcplusplus::threads::producer_threads::thread_routine(producer_threads *this)

{
  size_t *psVar1;
  queue<long> *pqVar2;
  long *plVar3;
  char cVar4;
  int iVar5;
  long lVar6;
  ostream *poVar7;
  int *piVar8;
  ostream *poVar9;
  ulong uVar10;
  timespec ts;
  unique_lock<std::mutex> local_68;
  long local_58;
  ofstream *local_50;
  undefined1 *local_48;
  undefined1 local_40 [16];
  
  lVar6 = syscall(0xba);
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)(this->super_generic_threads).mutex);
  if (iVar5 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Producer thread ",0x10);
    poVar7 = std::ostream::_M_insert<long>((long)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," started.",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    pthread_mutex_unlock((pthread_mutex_t *)(this->super_generic_threads).mutex);
    if ((this->super_generic_threads).num_processed < (this->super_generic_threads).target) {
      local_50 = &(this->super_generic_threads).logfile;
      local_48 = &(this->super_generic_threads).field_0xd0;
      local_58 = lVar6;
      do {
        local_68._M_device = (mutex_type *)0x0;
        local_68._8_8_ = 5000;
        do {
          iVar5 = nanosleep((timespec *)&local_68,(timespec *)&local_68);
          if (iVar5 != -1) break;
          piVar8 = __errno_location();
        } while (*piVar8 == 4);
        iVar5 = pthread_mutex_lock((pthread_mutex_t *)(this->super_generic_threads).mutex);
        if (iVar5 != 0) goto LAB_001042c9;
        while (pqVar2 = (this->super_generic_threads).buffer,
              pqVar2->current_size == pqVar2->capacity) {
          local_68._M_device = (this->super_generic_threads).mutex;
          local_68._M_owns = true;
          std::condition_variable::wait((unique_lock *)(this->super_generic_threads).waitCV);
          local_68._M_device = (mutex_type *)0x0;
          local_68._8_8_ = (ulong)(uint7)local_68._9_7_ << 8;
          std::unique_lock<std::mutex>::~unique_lock(&local_68);
        }
        if ((this->super_generic_threads).num_processed == (this->super_generic_threads).target)
        goto LAB_0010424d;
        lVar6 = lrand48();
        pqVar2 = (this->super_generic_threads).buffer;
        plVar3 = (pqVar2->array)._M_t.super___uniq_ptr_impl<long,_std::default_delete<long[]>_>._M_t
                 .super__Tuple_impl<0UL,_long_*,_std::default_delete<long[]>_>.
                 super__Head_base<0UL,_long_*,_false>._M_head_impl;
        uVar10 = (pqVar2->back_index + 1) % pqVar2->capacity;
        pqVar2->back_index = uVar10;
        plVar3[uVar10] = lVar6;
        pqVar2->current_size = pqVar2->current_size + 1;
        timespec_get(local_40,1);
        cVar4 = std::__basic_file<char>::is_open();
        if ((cVar4 != '\0') &&
           (((&(this->super_generic_threads).field_0x80)
             [*(long *)(*(long *)&(this->super_generic_threads).logfile + -0x18)] & 5) == 0)) {
          poVar9 = std::ostream::_M_insert<long>((long)local_50);
          lVar6 = *(long *)poVar9;
          poVar7 = poVar9 + *(long *)(lVar6 + -0x18);
          if (poVar9[*(long *)(lVar6 + -0x18) + 0xe1] == (ostream)0x0) {
            std::ios::widen((char)poVar7);
            poVar7[0xe1] = (ostream)0x1;
            lVar6 = *(long *)poVar9;
          }
          poVar7[0xe0] = (ostream)0x30;
          *(undefined8 *)(poVar9 + *(long *)(lVar6 + -0x18) + 0x10) = 9;
          poVar7 = std::ostream::_M_insert<long>((long)poVar9);
          *(undefined8 *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x10) = 0;
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," Producer ",10);
          poVar7 = std::ostream::_M_insert<long>((long)poVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
          poVar7 = std::ostream::_M_insert<long>((long)poVar7);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Producer thread ",0x10);
        poVar7 = std::ostream::_M_insert<long>((long)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," produced ",10);
        poVar7 = std::ostream::_M_insert<long>((long)poVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," and stored it at index ",0x18);
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        psVar1 = &(this->super_generic_threads).num_processed;
        *psVar1 = *psVar1 + 1;
        pthread_mutex_unlock((pthread_mutex_t *)(this->super_generic_threads).mutex);
        std::condition_variable::notify_all();
      } while ((this->super_generic_threads).num_processed < (this->super_generic_threads).target);
    }
    iVar5 = pthread_mutex_lock((pthread_mutex_t *)(this->super_generic_threads).mutex);
    if (iVar5 == 0) {
LAB_0010424d:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Producer thread ",0x10);
      poVar7 = std::ostream::_M_insert<long>((long)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," finished.",10);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      pthread_mutex_unlock((pthread_mutex_t *)(this->super_generic_threads).mutex);
      return;
    }
  }
LAB_001042c9:
  std::__throw_system_error(iVar5);
}

Assistant:

void producer_threads::thread_routine(){
	const auto thread_id = GET_TID;
	struct timespec ts;
	lock();
	std::cout << "Producer thread " << thread_id << " started." << std::endl;
	unlock();
	while(num_processed < target){
	    std::this_thread::sleep_for(std::chrono::microseconds(5));//sleep for 5 microseconds so that other producer threads have an opportunity to acquire the mutex
	    lock();
	    while(buffer->isFull()){
		wait();
	    }
	    if(num_processed == target){
		std::cout << "Producer thread " << thread_id << " finished." << std::endl;
		unlock();
		return;
	    }

	    const long num = lrand48();
	    const size_t index = buffer->enqueue(num);
	    timespec_get(&ts, TIME_UTC);
	    if(logfile.is_open() && logfile)
		logfile << ts.tv_sec << std::setfill('0') << std::setw(9) << ts.tv_nsec << std::setw(0) << " Producer " << thread_id << " " << index << " " << num << std::endl;

	    std::cout << "Producer thread " << thread_id << " produced " << num << " and stored it at index " << index << std::endl;
	    ++num_processed;
	    unlock();
	    notify();
	}
	lock();
	std::cout << "Producer thread " << thread_id << " finished." << std::endl;
	unlock();
    }